

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O2

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pTVar3;
  ComputationGraph *pCVar4;
  pointer pTVar5;
  pointer pVVar6;
  Node *pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  AlignedMemoryPool<6U> *this_00;
  uint uVar12;
  void *pvVar13;
  ulong *puVar14;
  ulong uVar15;
  pointer pVVar16;
  long lVar17;
  char *__assertion;
  size_type __n;
  ulong __n_00;
  bool bVar18;
  reference rVar19;
  allocator_type local_b9;
  ulong local_b8;
  ulong local_b0;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  vector<bool,_std::allocator<bool>_> needs_derivative;
  vector<bool,_std::allocator<bool>_> in_computation;
  
  pTVar3 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = (ulong)(from_where->t + 1);
  if ((ulong)(((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x48) < uVar15) {
    __assertion = "from_where+1 <= nfxs.size()";
    uVar12 = 0x56;
  }
  else {
    pCVar4 = (this->super_ExecutionEngine).cg;
    if ((ulong)((long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) < uVar15) {
      __assertion = "from_where+1 <= cg.nodes.size()";
      uVar12 = 0x57;
    }
    else {
      uVar12 = Dim::size(&pTVar3[from_where->t].d);
      if (uVar12 != 1) {
        std::operator<<((ostream *)&std::cerr,"backward() called on non-scalar node.\n");
        abort();
      }
      local_b8 = (ulong)from_where->t;
      uVar15 = (ulong)(from_where->t + 1);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->ndEdfs,uVar15);
      lVar17 = 0;
      dEdfs->used = 0;
      local_b0 = uVar15;
      while( true ) {
        if (uVar15 * 0x48 - lVar17 == 0) {
          if (dEdfs->used != 0) {
            memset(dEdfs->mem,0,dEdfs->used);
          }
          (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].v = kSCALAR_ONE;
          in_computation.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&needs_derivative,local_b0,(bool *)&in_computation,(allocator_type *)&xs);
          pCVar4 = (this->super_ExecutionEngine).cg;
          pVVar6 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pVVar16 = (pCVar4->parameter_nodes).
                         super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                         ._M_impl.super__Vector_impl_data._M_start; pVVar16 != pVVar6;
              pVVar16 = pVVar16 + 1) {
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&needs_derivative,(ulong)pVVar16->t);
            *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
          }
          for (__n = 0; __n != local_b0; __n = __n + 1) {
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](&needs_derivative,__n);
            bVar18 = (*rVar19._M_p & rVar19._M_mask) != 0;
            pNVar7 = (((this->super_ExecutionEngine).cg)->nodes).
                     super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start[__n];
            pVVar6 = (pNVar7->args).
                     super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pVVar16 = *(pointer *)
                            &(pNVar7->args).
                             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                             ._M_impl; pVVar16 != pVVar6; pVVar16 = pVVar16 + 1) {
              rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&needs_derivative,(ulong)pVVar16->t);
              bVar18 = (bool)(bVar18 | (*rVar19._M_p & rVar19._M_mask) != 0);
            }
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](&needs_derivative,__n);
            puVar14 = rVar19._M_p;
            if (bVar18) {
              uVar15 = rVar19._M_mask | *puVar14;
            }
            else {
              uVar15 = ~rVar19._M_mask & *puVar14;
            }
            *puVar14 = uVar15;
          }
          xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)xs.
                                super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&in_computation,local_b0,(bool *)&xs,&local_b9);
          rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](&in_computation,local_b8);
          *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
          xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar15 = local_b8;
          while (-1 < (int)uVar15) {
            __n_00 = uVar15 & 0xffffffff;
            local_b8 = uVar15;
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](&in_computation,__n_00);
            if ((*rVar19._M_p & rVar19._M_mask) != 0) {
              pNVar7 = (((this->super_ExecutionEngine).cg)->nodes).
                       super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start[__n_00];
              std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                        (&xs,(ulong)((long)(pNVar7->args).
                                           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pNVar7->args).
                                          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                             0xffffffff);
              pVVar6 = (pNVar7->args).
                       super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar15 = 0;
              for (pVVar16 = (pNVar7->args).
                             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start; pVVar16 != pVVar6;
                  pVVar16 = pVVar16 + 1) {
                uVar12 = pVVar16->t;
                rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&in_computation,(ulong)uVar12);
                *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
                xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar15] =
                     (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar12;
                uVar15 = (ulong)((int)uVar15 + 1);
              }
              pVVar6 = (pNVar7->args).
                       super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar12 = 0;
              for (pVVar16 = (pNVar7->args).
                             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start; pVVar16 != pVVar6;
                  pVVar16 = pVVar16 + 1) {
                uVar2 = pVVar16->t;
                rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&needs_derivative,(ulong)uVar2);
                if ((*rVar19._M_p & rVar19._M_mask) != 0) {
                  pTVar3 = (this->ndEdfs).
                           super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  Node::backward(pNVar7,&xs,
                                 (this->nfxs).
                                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                 _M_impl.super__Vector_impl_data._M_start + __n_00,pTVar3 + __n_00,
                                 uVar12,pTVar3 + uVar2);
                }
                uVar12 = uVar12 + 1;
              }
            }
            uVar15 = (ulong)((int)local_b8 - 1);
          }
          pCVar4 = (this->super_ExecutionEngine).cg;
          pVVar6 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pVVar16 = (pCVar4->parameter_nodes).
                         super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                         ._M_impl.super__Vector_impl_data._M_start; pVVar16 != pVVar6;
              pVVar16 = pVVar16 + 1) {
            pNVar7 = (((this->super_ExecutionEngine).cg)->nodes).
                     super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start[pVVar16->t];
            (*pNVar7->_vptr_Node[10])
                      (pNVar7,(this->ndEdfs).
                              super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                              super__Vector_impl_data._M_start + pVVar16->t);
          }
          std::_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
          ~_Vector_base(&xs.
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       );
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&in_computation.super__Bvector_base<std::allocator<bool>_>);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&needs_derivative.super__Bvector_base<std::allocator<bool>_>);
          return;
        }
        pTVar3 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        needs_derivative.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_end_of_storage._0_4_ = *(undefined4 *)((long)(pTVar3->d).d + lVar17 + 0x20);
        puVar1 = (undefined8 *)((long)(pTVar3->d).d + lVar17);
        needs_derivative.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar1;
        needs_derivative.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._8_8_ = puVar1[1];
        needs_derivative.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)puVar1[2];
        needs_derivative.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._8_8_ = puVar1[3];
        puVar1 = (undefined8 *)((long)(pTVar3->d).d + lVar17);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        uVar10 = puVar1[2];
        uVar11 = puVar1[3];
        pTVar5 = (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)(pTVar5->d).d + lVar17 + 0x20) =
             *(undefined4 *)((long)(pTVar3->d).d + lVar17 + 0x20);
        puVar1 = (undefined8 *)((long)(pTVar5->d).d + lVar17);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1[2] = uVar10;
        puVar1[3] = uVar11;
        this_00 = dEdfs;
        uVar12 = Dim::size((Dim *)&needs_derivative);
        pvVar13 = AlignedMemoryPool<6U>::allocate(this_00,(ulong)uVar12 << 2);
        *(void **)((long)(&((this->ndEdfs).
                            super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                            super__Vector_impl_data._M_start)->d + 1) + lVar17 + 4) = pvVar13;
        if (pvVar13 == (void *)0x0) break;
        lVar17 = lVar17 + 0x48;
      }
      __assertion = "ndEdfs[i].v";
      uVar12 = 100;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                ,uVar12,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    assert(ndEdfs[i].v);
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}